

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_bd8925::HandleStringsCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  char cVar1;
  string_view value;
  cmExecutionStatus *pcVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  PolicyStatus PVar6;
  BOM BVar7;
  uint uVar8;
  size_type sVar9;
  const_reference pvVar10;
  cmMakefile *pcVar11;
  string *psVar12;
  undefined8 uVar13;
  char *pcVar14;
  streamoff sVar15;
  long lVar16;
  ulong uVar17;
  reference pcVar18;
  PolicyID id;
  bool local_8a5;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_7d0;
  char i_2;
  const_iterator __end2;
  const_iterator __begin2;
  string *__range2;
  string *sr;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  string output;
  char *sep;
  uint local_768;
  uint j_2;
  uint j_1;
  uint j;
  uint num_utf8_bytes;
  int c1;
  uint i_1;
  int c;
  string current_str;
  undefined1 local_720 [8];
  string s;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  strings;
  uint local_6e0;
  int output_size;
  uint bytes_rem;
  int bom_found;
  undefined1 local_6b8 [8];
  ifstream fin;
  undefined1 local_4b0 [8];
  string binaryFileName;
  string local_470;
  char local_449;
  string local_448;
  string local_428;
  allocator<char> local_401;
  string local_400;
  string local_3e0;
  string local_3c0;
  int local_39c;
  undefined1 local_398 [4];
  int len_1;
  int local_374;
  undefined1 local_370 [4];
  int len;
  int local_34c;
  undefined1 local_348 [4];
  int count;
  int local_324;
  string local_320;
  uint local_300;
  int local_2fc;
  uint i;
  int arg_mode;
  int encoding;
  bool hex_conversion_enabled;
  bool newline_consume;
  bool store_regex;
  bool have_regex;
  RegularExpression regex;
  int local_b8;
  uint limit_count;
  int limit_output;
  int limit_input;
  uint maxlen;
  uint minlen;
  string *outVar;
  string local_98;
  undefined1 local_78 [8];
  string fileName;
  allocator<char> local_41;
  string local_40;
  cmExecutionStatus *local_20;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  local_20 = status;
  status_local = (cmExecutionStatus *)args;
  sVar9 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  pcVar2 = local_20;
  if (sVar9 < 3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"STRINGS requires a file name and output variable",&local_41);
    cmExecutionStatus::SetError(pcVar2,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    args_local._7_1_ = 0;
  }
  else {
    pvVar10 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)status_local,1);
    std::__cxx11::string::string((string *)local_78,(string *)pvVar10);
    bVar3 = cmsys::SystemTools::FileIsFullPath((string *)local_78);
    if (!bVar3) {
      pcVar11 = cmExecutionStatus::GetMakefile(local_20);
      psVar12 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(pcVar11);
      outVar._7_1_ = 0x2f;
      pvVar10 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)status_local,1);
      cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string_const&>
                (&local_98,psVar12,(char *)((long)&outVar + 7),pvVar10);
      std::__cxx11::string::operator=((string *)local_78,(string *)&local_98);
      std::__cxx11::string::~string((string *)&local_98);
    }
    _maxlen = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)status_local,2);
    limit_input = 0;
    limit_output = 0;
    limit_count = 0xffffffff;
    local_b8 = -1;
    regex._556_4_ = 0;
    cmsys::RegularExpression::RegularExpression((RegularExpression *)&encoding);
    arg_mode._3_1_ = 0;
    arg_mode._2_1_ = 1;
    arg_mode._1_1_ = 0;
    arg_mode._0_1_ = 1;
    i = 0;
    local_2fc = 0;
    for (local_300 = 3; uVar17 = (ulong)local_300,
        sVar9 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)status_local), uVar17 < sVar9; local_300 = local_300 + 1) {
      pvVar10 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)status_local,(ulong)local_300);
      bVar3 = std::operator==(pvVar10,"LIMIT_INPUT");
      if (bVar3) {
        local_2fc = 1;
      }
      else {
        pvVar10 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)status_local,(ulong)local_300);
        bVar3 = std::operator==(pvVar10,"LIMIT_OUTPUT");
        if (bVar3) {
          local_2fc = 2;
        }
        else {
          pvVar10 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)status_local,(ulong)local_300);
          bVar3 = std::operator==(pvVar10,"LIMIT_COUNT");
          if (bVar3) {
            local_2fc = 3;
          }
          else {
            pvVar10 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)status_local,(ulong)local_300);
            bVar3 = std::operator==(pvVar10,"LENGTH_MINIMUM");
            if (bVar3) {
              local_2fc = 4;
            }
            else {
              pvVar10 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)status_local,(ulong)local_300);
              bVar3 = std::operator==(pvVar10,"LENGTH_MAXIMUM");
              if (bVar3) {
                local_2fc = 5;
              }
              else {
                pvVar10 = std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)status_local,(ulong)local_300);
                bVar3 = std::operator==(pvVar10,"REGEX");
                if (bVar3) {
                  local_2fc = 7;
                }
                else {
                  pvVar10 = std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          *)status_local,(ulong)local_300);
                  bVar3 = std::operator==(pvVar10,"NEWLINE_CONSUME");
                  if (bVar3) {
                    arg_mode._1_1_ = 1;
                    local_2fc = 0;
                  }
                  else {
                    pvVar10 = std::
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            *)status_local,(ulong)local_300);
                    bVar3 = std::operator==(pvVar10,"NO_HEX_CONVERSION");
                    if (bVar3) {
                      arg_mode._0_1_ = 0;
                      local_2fc = 0;
                    }
                    else {
                      pvVar10 = std::
                                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              *)status_local,(ulong)local_300);
                      bVar3 = std::operator==(pvVar10,"ENCODING");
                      pcVar2 = local_20;
                      if (bVar3) {
                        local_2fc = 8;
                      }
                      else {
                        if (local_2fc == 1) {
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)status_local,(ulong)local_300);
                          uVar13 = std::__cxx11::string::c_str();
                          iVar5 = __isoc99_sscanf(uVar13,"%d",&limit_count);
                          pcVar2 = local_20;
                          if ((iVar5 != 1) || ((int)limit_count < 0)) {
                            pvVar10 = std::
                                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)status_local,(ulong)local_300);
                            cmStrCat<char_const(&)[35],std::__cxx11::string_const&,char_const(&)[30]>
                                      (&local_320,
                                       (char (*) [35])"STRINGS option LIMIT_INPUT value \"",pvVar10,
                                       (char (*) [30])"\" is not an unsigned integer.");
                            cmExecutionStatus::SetError(pcVar2,&local_320);
                            std::__cxx11::string::~string((string *)&local_320);
                            args_local._7_1_ = 0;
                            local_324 = 1;
                            goto LAB_00663309;
                          }
                        }
                        else if (local_2fc == 2) {
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)status_local,(ulong)local_300);
                          uVar13 = std::__cxx11::string::c_str();
                          iVar5 = __isoc99_sscanf(uVar13,"%d",&local_b8);
                          pcVar2 = local_20;
                          if ((iVar5 != 1) || (local_b8 < 0)) {
                            pvVar10 = std::
                                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)status_local,(ulong)local_300);
                            cmStrCat<char_const(&)[36],std::__cxx11::string_const&,char_const(&)[30]>
                                      ((string *)local_348,
                                       (char (*) [36])"STRINGS option LIMIT_OUTPUT value \"",pvVar10
                                       ,(char (*) [30])"\" is not an unsigned integer.");
                            cmExecutionStatus::SetError(pcVar2,(string *)local_348);
                            std::__cxx11::string::~string((string *)local_348);
                            args_local._7_1_ = 0;
                            local_324 = 1;
                            goto LAB_00663309;
                          }
                        }
                        else if (local_2fc == 3) {
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)status_local,(ulong)local_300);
                          uVar13 = std::__cxx11::string::c_str();
                          iVar5 = __isoc99_sscanf(uVar13,"%d",&local_34c);
                          pcVar2 = local_20;
                          if ((iVar5 != 1) || (local_34c < 0)) {
                            pvVar10 = std::
                                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)status_local,(ulong)local_300);
                            cmStrCat<char_const(&)[35],std::__cxx11::string_const&,char_const(&)[30]>
                                      ((string *)local_370,
                                       (char (*) [35])"STRINGS option LIMIT_COUNT value \"",pvVar10,
                                       (char (*) [30])"\" is not an unsigned integer.");
                            cmExecutionStatus::SetError(pcVar2,(string *)local_370);
                            std::__cxx11::string::~string((string *)local_370);
                            args_local._7_1_ = 0;
                            local_324 = 1;
                            goto LAB_00663309;
                          }
                          regex._556_4_ = local_34c;
                        }
                        else if (local_2fc == 4) {
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)status_local,(ulong)local_300);
                          uVar13 = std::__cxx11::string::c_str();
                          iVar5 = __isoc99_sscanf(uVar13,"%d",&local_374);
                          pcVar2 = local_20;
                          if ((iVar5 != 1) || (local_374 < 0)) {
                            pvVar10 = std::
                                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)status_local,(ulong)local_300);
                            cmStrCat<char_const(&)[38],std::__cxx11::string_const&,char_const(&)[30]>
                                      ((string *)local_398,
                                       (char (*) [38])"STRINGS option LENGTH_MINIMUM value \"",
                                       pvVar10,(char (*) [30])"\" is not an unsigned integer.");
                            cmExecutionStatus::SetError(pcVar2,(string *)local_398);
                            std::__cxx11::string::~string((string *)local_398);
                            args_local._7_1_ = 0;
                            local_324 = 1;
                            goto LAB_00663309;
                          }
                          limit_input = local_374;
                        }
                        else if (local_2fc == 5) {
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)status_local,(ulong)local_300);
                          uVar13 = std::__cxx11::string::c_str();
                          iVar5 = __isoc99_sscanf(uVar13,"%d",&local_39c);
                          pcVar2 = local_20;
                          if ((iVar5 != 1) || (local_39c < 0)) {
                            pvVar10 = std::
                                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)status_local,(ulong)local_300);
                            cmStrCat<char_const(&)[38],std::__cxx11::string_const&,char_const(&)[30]>
                                      (&local_3c0,
                                       (char (*) [38])"STRINGS option LENGTH_MAXIMUM value \"",
                                       pvVar10,(char (*) [30])"\" is not an unsigned integer.");
                            cmExecutionStatus::SetError(pcVar2,&local_3c0);
                            std::__cxx11::string::~string((string *)&local_3c0);
                            args_local._7_1_ = 0;
                            local_324 = 1;
                            goto LAB_00663309;
                          }
                          limit_output = local_39c;
                        }
                        else if (local_2fc == 7) {
                          pvVar10 = std::
                                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)status_local,(ulong)local_300);
                          bVar3 = cmsys::RegularExpression::compile
                                            ((RegularExpression *)&encoding,pvVar10);
                          pcVar2 = local_20;
                          if (!bVar3) {
                            pvVar10 = std::
                                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)status_local,(ulong)local_300);
                            cmStrCat<char_const(&)[29],std::__cxx11::string_const&,char_const(&)[25]>
                                      (&local_3e0,(char (*) [29])"STRINGS option REGEX value \"",
                                       pvVar10,(char (*) [25])"\" could not be compiled.");
                            cmExecutionStatus::SetError(pcVar2,&local_3e0);
                            std::__cxx11::string::~string((string *)&local_3e0);
                            args_local._7_1_ = 0;
                            local_324 = 1;
                            goto LAB_00663309;
                          }
                          arg_mode._3_1_ = 1;
                          pcVar11 = cmExecutionStatus::GetMakefile(local_20);
                          PVar6 = cmMakefile::GetPolicyStatus(pcVar11,CMP0159,false);
                          if (PVar6 != OLD) {
                            if (PVar6 != WARN) goto LAB_006624c9;
                            pcVar11 = cmExecutionStatus::GetMakefile(local_20);
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&local_400,"CMAKE_POLICY_WARNING_CMP0159",
                                       &local_401);
                            bVar3 = cmMakefile::PolicyOptionalWarningEnabled(pcVar11,&local_400);
                            std::__cxx11::string::~string((string *)&local_400);
                            std::allocator<char>::~allocator(&local_401);
                            if (bVar3) {
                              pcVar11 = cmExecutionStatus::GetMakefile(local_20);
                              cmPolicies::GetPolicyWarning_abi_cxx11_
                                        (&local_448,(cmPolicies *)0x9f,id);
                              local_449 = '\n';
                              cmStrCat<std::__cxx11::string,char,char_const(&)[63]>
                                        (&local_428,&local_448,&local_449,
                                         (char (*) [63])
                                         "For compatibility, CMake is leaving CMAKE_MATCH_<n> unchanged."
                                        );
                              cmMakefile::IssueMessage(pcVar11,AUTHOR_WARNING,&local_428);
                              std::__cxx11::string::~string((string *)&local_428);
                              std::__cxx11::string::~string((string *)&local_448);
                            }
                          }
                          arg_mode._2_1_ = 0;
                        }
                        else {
                          if (local_2fc != 8) {
                            pvVar10 = std::
                                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)status_local,(ulong)local_300);
                            cmStrCat<char_const(&)[33],std::__cxx11::string_const&,char_const(&)[2]>
                                      ((string *)((long)&binaryFileName.field_2 + 8),
                                       (char (*) [33])"STRINGS given unknown argument \"",pvVar10,
                                       (char (*) [2])0x11593aa);
                            cmExecutionStatus::SetError
                                      (pcVar2,(string *)((long)&binaryFileName.field_2 + 8));
                            std::__cxx11::string::~string
                                      ((string *)(binaryFileName.field_2._M_local_buf + 8));
                            args_local._7_1_ = 0;
                            local_324 = 1;
                            goto LAB_00663309;
                          }
                          pvVar10 = std::
                                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)status_local,(ulong)local_300);
                          bVar3 = std::operator==(pvVar10,"UTF-8");
                          if (bVar3) {
                            i = 1;
                          }
                          else {
                            pvVar10 = std::
                                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)status_local,(ulong)local_300);
                            bVar3 = std::operator==(pvVar10,"UTF-16LE");
                            if (bVar3) {
                              i = 3;
                            }
                            else {
                              pvVar10 = std::
                                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)status_local,(ulong)local_300);
                              bVar3 = std::operator==(pvVar10,"UTF-16BE");
                              if (bVar3) {
                                i = 2;
                              }
                              else {
                                pvVar10 = std::
                                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)status_local,(ulong)local_300);
                                bVar3 = std::operator==(pvVar10,"UTF-32LE");
                                if (bVar3) {
                                  i = 5;
                                }
                                else {
                                  pvVar10 = std::
                                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)status_local,(ulong)local_300);
                                  bVar3 = std::operator==(pvVar10,"UTF-32BE");
                                  pcVar2 = local_20;
                                  if (!bVar3) {
                                    pvVar10 = std::
                                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)status_local,(ulong)local_300);
                                    cmStrCat<char_const(&)[26],std::__cxx11::string_const&,char_const(&)[18]>
                                              (&local_470,
                                               (char (*) [26])"STRINGS option ENCODING \"",pvVar10,
                                               (char (*) [18])"\" not recognized.");
                                    cmExecutionStatus::SetError(pcVar2,&local_470);
                                    std::__cxx11::string::~string((string *)&local_470);
                                    args_local._7_1_ = 0;
                                    local_324 = 1;
                                    goto LAB_00663309;
                                  }
                                  i = 4;
                                }
                              }
                            }
                          }
                        }
LAB_006624c9:
                        local_2fc = 0;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    if (((byte)arg_mode & 1) != 0) {
      pcVar11 = cmExecutionStatus::GetMakefile(local_20);
      psVar12 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(pcVar11);
      cmStrCat<std::__cxx11::string_const&,char_const(&)[41]>
                ((string *)local_4b0,psVar12,
                 (char (*) [41])"/CMakeFiles/FileCommandStringsBinaryFile");
      bVar3 = cmHexFileConverter::TryConvert((string *)local_78,(string *)local_4b0);
      if (bVar3) {
        std::__cxx11::string::operator=((string *)local_78,(string *)local_4b0);
      }
      std::__cxx11::string::~string((string *)local_4b0);
    }
    pcVar14 = (char *)std::__cxx11::string::c_str();
    std::ifstream::ifstream(local_6b8,pcVar14,_S_in);
    bVar4 = std::ios::operator!((ios *)(local_6b8 + (long)*(_func_int **)((long)local_6b8 + -0x18)))
    ;
    pcVar2 = local_20;
    if ((bVar4 & 1) == 0) {
      BVar7 = cmsys::FStream::ReadBOM((istream *)local_6b8);
      if ((i == 0) && (BVar7 != BOM_None)) {
        i = BVar7;
      }
      local_6e0 = 0;
      if ((i == 3) || (i == 2)) {
        local_6e0 = 1;
      }
      if ((i == 5) || (i == 4)) {
        local_6e0 = 3;
      }
      strings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&s.field_2 + 8));
      std::__cxx11::string::string((string *)local_720);
      do {
        if (regex._556_4_ == 0) {
LAB_00662743:
          if (-1 < (int)limit_count) {
            current_str.field_2._8_8_ = std::istream::tellg();
            sVar15 = std::fpos::operator_cast_to_long
                               ((fpos *)(current_str.field_2._M_local_buf + 8));
            local_8a5 = false;
            if ((int)limit_count <= (int)sVar15) goto LAB_006627e0;
          }
          local_8a5 = std::ios::operator_cast_to_bool
                                ((ios *)(local_6b8 + (long)*(_func_int **)((long)local_6b8 + -0x18))
                                );
        }
        else {
          sVar9 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)((long)&s.field_2 + 8));
          local_8a5 = false;
          if (sVar9 < (uint)regex._556_4_) goto LAB_00662743;
        }
LAB_006627e0:
        if (local_8a5 == false) break;
        std::__cxx11::string::string((string *)&i_1);
        c1 = std::istream::get();
        for (num_utf8_bytes = 0; num_utf8_bytes < local_6e0; num_utf8_bytes = num_utf8_bytes + 1) {
          uVar8 = std::istream::get();
          bVar4 = std::ios::operator!((ios *)(local_6b8 +
                                             (long)*(_func_int **)((long)local_6b8 + -0x18)));
          if ((bVar4 & 1) != 0) {
            std::istream::putback((char)local_6b8);
            break;
          }
          c1 = c1 << 8 | uVar8;
        }
        if (i == 3) {
          c1 = (c1 & 0xffU) << 8 | (int)(c1 & 0xff00U) >> 8;
        }
        else if (i == 5) {
          c1 = c1 << 0x18 | (c1 & 0xff00U) << 8 | (int)(c1 & 0xff0000U) >> 8 | (uint)c1 >> 0x18;
        }
        if (c1 == 0xd) {
          local_324 = 6;
        }
        else {
          if (((c1 < 0) || (0xff < c1)) ||
             (((iVar5 = isprint(c1), iVar5 == 0 && (c1 != 9)) &&
              ((c1 != 10 || ((arg_mode._1_1_ & 1) == 0)))))) {
            if (i == 1) {
              j_1 = 0;
              for (j_2 = 0; j_1 == 0 && j_2 < 3; j_2 = j_2 + 1) {
                if ((c1 & (uint)HandleStringsCommand::utf8_check_table[j_2][0]) ==
                    (uint)HandleStringsCommand::utf8_check_table[j_2][1]) {
                  j_1 = j_2 + 2;
                }
              }
              for (local_768 = 0; local_768 < j_1; local_768 = local_768 + 1) {
                if (local_768 != 0) {
                  c1 = std::istream::get();
                  bVar4 = std::ios::operator!((ios *)(local_6b8 +
                                                     (long)*(_func_int **)((long)local_6b8 + -0x18))
                                             );
                  if (((bVar4 & 1) != 0) || ((c1 & 0xc0U) != 0x80)) {
                    std::istream::putback((char)local_6b8);
                    break;
                  }
                }
                std::__cxx11::string::operator+=((string *)&i_1,(char)c1);
              }
              uVar17 = std::__cxx11::string::length();
              if (uVar17 != j_1) {
                for (sep._4_4_ = 0; lVar16 = std::__cxx11::string::size(),
                    (ulong)sep._4_4_ < lVar16 - 1U; sep._4_4_ = sep._4_4_ + 1) {
                  std::__cxx11::string::size();
                  std::__cxx11::string::operator[]((ulong)&i_1);
                  std::istream::putback((char)local_6b8);
                }
                std::__cxx11::string::clear();
              }
            }
          }
          else {
            std::__cxx11::string::operator+=((string *)&i_1,(char)c1);
          }
          if ((c1 == 10) && ((arg_mode._1_1_ & 1) == 0)) {
            uVar17 = std::__cxx11::string::length();
            if (((uint)limit_input <= uVar17) &&
               (((arg_mode._3_1_ & 1) == 0 ||
                (bVar3 = cmsys::RegularExpression::find
                                   ((RegularExpression *)&encoding,(string *)local_720), bVar3)))) {
              if ((arg_mode._2_1_ & 1) != 0) {
                pcVar11 = cmExecutionStatus::GetMakefile(local_20);
                cmMakefile::ClearMatches(pcVar11);
                pcVar11 = cmExecutionStatus::GetMakefile(local_20);
                cmMakefile::StoreMatches(pcVar11,(RegularExpression *)&encoding);
              }
              iVar5 = std::__cxx11::string::size();
              strings.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
                   iVar5 + 1 +
                   strings.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
              if ((-1 < local_b8) &&
                 (local_b8 <=
                  strings.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_)) {
                std::__cxx11::string::clear();
                local_324 = 7;
                goto LAB_00662f8b;
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)((long)&s.field_2 + 8),(value_type *)local_720);
            }
            std::__cxx11::string::clear();
          }
          else {
            uVar17 = std::__cxx11::string::empty();
            if ((uVar17 & 1) == 0) {
              std::__cxx11::string::operator+=((string *)local_720,(string *)&i_1);
            }
            else {
              uVar17 = std::__cxx11::string::length();
              if ((((uint)limit_input <= uVar17) &&
                  (uVar17 = std::__cxx11::string::empty(), (uVar17 & 1) == 0)) &&
                 (((arg_mode._3_1_ & 1) == 0 ||
                  (bVar3 = cmsys::RegularExpression::find
                                     ((RegularExpression *)&encoding,(string *)local_720), bVar3))))
              {
                if ((arg_mode._2_1_ & 1) != 0) {
                  pcVar11 = cmExecutionStatus::GetMakefile(local_20);
                  cmMakefile::ClearMatches(pcVar11);
                  pcVar11 = cmExecutionStatus::GetMakefile(local_20);
                  cmMakefile::StoreMatches(pcVar11,(RegularExpression *)&encoding);
                }
                iVar5 = std::__cxx11::string::size();
                strings.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
                     iVar5 + 1 +
                     strings.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
                if ((-1 < local_b8) &&
                   (local_b8 <=
                    strings.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_)) {
                  std::__cxx11::string::clear();
                  local_324 = 7;
                  goto LAB_00662f8b;
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)((long)&s.field_2 + 8),(value_type *)local_720);
              }
              std::__cxx11::string::clear();
            }
          }
          if ((limit_output != 0) &&
             (uVar17 = std::__cxx11::string::size(), uVar17 == (uint)limit_output)) {
            uVar17 = std::__cxx11::string::length();
            if (((uint)limit_input <= uVar17) &&
               (((arg_mode._3_1_ & 1) == 0 ||
                (bVar3 = cmsys::RegularExpression::find
                                   ((RegularExpression *)&encoding,(string *)local_720), bVar3)))) {
              if ((arg_mode._2_1_ & 1) != 0) {
                pcVar11 = cmExecutionStatus::GetMakefile(local_20);
                cmMakefile::ClearMatches(pcVar11);
                pcVar11 = cmExecutionStatus::GetMakefile(local_20);
                cmMakefile::StoreMatches(pcVar11,(RegularExpression *)&encoding);
              }
              iVar5 = std::__cxx11::string::size();
              strings.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
                   iVar5 + 1 +
                   strings.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
              if ((-1 < local_b8) &&
                 (local_b8 <=
                  strings.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_)) {
                std::__cxx11::string::clear();
                local_324 = 7;
                goto LAB_00662f8b;
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)((long)&s.field_2 + 8),(value_type *)local_720);
            }
            std::__cxx11::string::clear();
          }
          local_324 = 0;
        }
LAB_00662f8b:
        std::__cxx11::string::~string((string *)&i_1);
      } while ((local_324 == 0) || (local_324 == 6));
      if ((((regex._556_4_ == 0) ||
           (sVar9 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)((long)&s.field_2 + 8)), sVar9 < (uint)regex._556_4_)) &&
          ((uVar17 = std::__cxx11::string::empty(), (uVar17 & 1) == 0 &&
           (uVar17 = std::__cxx11::string::length(), (uint)limit_input <= uVar17)))) &&
         (((arg_mode._3_1_ & 1) == 0 ||
          (bVar3 = cmsys::RegularExpression::find
                             ((RegularExpression *)&encoding,(string *)local_720), bVar3)))) {
        if ((arg_mode._2_1_ & 1) != 0) {
          pcVar11 = cmExecutionStatus::GetMakefile(local_20);
          cmMakefile::ClearMatches(pcVar11);
          pcVar11 = cmExecutionStatus::GetMakefile(local_20);
          cmMakefile::StoreMatches(pcVar11,(RegularExpression *)&encoding);
        }
        iVar5 = std::__cxx11::string::size();
        if ((local_b8 < 0) ||
           (iVar5 + 1 +
            strings.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ < local_b8)) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)((long)&s.field_2 + 8),(value_type *)local_720);
        }
      }
      output.field_2._8_8_ = (long)"PK\x01\x02" + 4;
      std::__cxx11::string::string((string *)&__range1);
      this = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&s.field_2 + 8);
      __end1 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(this);
      sr = (string *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(this);
      while (bVar3 = __gnu_cxx::operator!=
                               (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&sr), bVar3) {
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator*(&__end1);
        std::__cxx11::string::operator+=((string *)&__range1,(char *)output.field_2._8_8_);
        output.field_2._8_8_ = (long)"^date: +([^;]+); +author: +([^;]+);" + 0x22;
        __end2._M_current = (char *)std::__cxx11::string::begin();
        _Stack_7d0._M_current = (char *)std::__cxx11::string::end();
        while (bVar3 = __gnu_cxx::operator!=(&__end2,&stack0xfffffffffffff830), bVar3) {
          pcVar18 = __gnu_cxx::
                    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator*(&__end2);
          cVar1 = *pcVar18;
          if (cVar1 == ';') {
            std::__cxx11::string::operator+=((string *)&__range1,'\\');
          }
          std::__cxx11::string::operator+=((string *)&__range1,cVar1);
          __gnu_cxx::
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator++(&__end2);
        }
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end1);
      }
      pcVar11 = cmExecutionStatus::GetMakefile(local_20);
      psVar12 = _maxlen;
      value = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&__range1);
      cmMakefile::AddDefinition(pcVar11,psVar12,value);
      args_local._7_1_ = 1;
      local_324 = 1;
      std::__cxx11::string::~string((string *)&__range1);
      std::__cxx11::string::~string((string *)local_720);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&s.field_2 + 8));
    }
    else {
      cmStrCat<char_const(&)[15],std::__cxx11::string&,char_const(&)[18]>
                ((string *)&bytes_rem,(char (*) [15])"STRINGS file \"",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                 (char (*) [18])"\" cannot be read.");
      cmExecutionStatus::SetError(pcVar2,(string *)&bytes_rem);
      std::__cxx11::string::~string((string *)&bytes_rem);
      args_local._7_1_ = 0;
      local_324 = 1;
    }
    std::ifstream::~ifstream(local_6b8);
LAB_00663309:
    cmsys::RegularExpression::~RegularExpression((RegularExpression *)&encoding);
    std::__cxx11::string::~string((string *)local_78);
  }
  return (bool)(args_local._7_1_ & 1);
}

Assistant:

bool HandleStringsCommand(std::vector<std::string> const& args,
                          cmExecutionStatus& status)
{
  if (args.size() < 3) {
    status.SetError("STRINGS requires a file name and output variable");
    return false;
  }

  // Get the file to read.
  std::string fileName = args[1];
  if (!cmsys::SystemTools::FileIsFullPath(fileName)) {
    fileName =
      cmStrCat(status.GetMakefile().GetCurrentSourceDirectory(), '/', args[1]);
  }

  // Get the variable in which to store the results.
  std::string const& outVar = args[2];

  // Parse the options.
  enum
  {
    arg_none,
    arg_limit_input,
    arg_limit_output,
    arg_limit_count,
    arg_length_minimum,
    arg_length_maximum,
    arg_maximum,
    arg_regex,
    arg_encoding
  };
  unsigned int minlen = 0;
  unsigned int maxlen = 0;
  int limit_input = -1;
  int limit_output = -1;
  unsigned int limit_count = 0;
  cmsys::RegularExpression regex;
  bool have_regex = false;
  bool store_regex = true;
  bool newline_consume = false;
  bool hex_conversion_enabled = true;
  enum
  {
    encoding_none = cmsys::FStream::BOM_None,
    encoding_utf8 = cmsys::FStream::BOM_UTF8,
    encoding_utf16le = cmsys::FStream::BOM_UTF16LE,
    encoding_utf16be = cmsys::FStream::BOM_UTF16BE,
    encoding_utf32le = cmsys::FStream::BOM_UTF32LE,
    encoding_utf32be = cmsys::FStream::BOM_UTF32BE
  };
  int encoding = encoding_none;
  int arg_mode = arg_none;
  for (unsigned int i = 3; i < args.size(); ++i) {
    if (args[i] == "LIMIT_INPUT") {
      arg_mode = arg_limit_input;
    } else if (args[i] == "LIMIT_OUTPUT") {
      arg_mode = arg_limit_output;
    } else if (args[i] == "LIMIT_COUNT") {
      arg_mode = arg_limit_count;
    } else if (args[i] == "LENGTH_MINIMUM") {
      arg_mode = arg_length_minimum;
    } else if (args[i] == "LENGTH_MAXIMUM") {
      arg_mode = arg_length_maximum;
    } else if (args[i] == "REGEX") {
      arg_mode = arg_regex;
    } else if (args[i] == "NEWLINE_CONSUME") {
      newline_consume = true;
      arg_mode = arg_none;
    } else if (args[i] == "NO_HEX_CONVERSION") {
      hex_conversion_enabled = false;
      arg_mode = arg_none;
    } else if (args[i] == "ENCODING") {
      arg_mode = arg_encoding;
    } else if (arg_mode == arg_limit_input) {
      if (sscanf(args[i].c_str(), "%d", &limit_input) != 1 ||
          limit_input < 0) {
        status.SetError(cmStrCat("STRINGS option LIMIT_INPUT value \"",
                                 args[i], "\" is not an unsigned integer."));
        return false;
      }
      arg_mode = arg_none;
    } else if (arg_mode == arg_limit_output) {
      if (sscanf(args[i].c_str(), "%d", &limit_output) != 1 ||
          limit_output < 0) {
        status.SetError(cmStrCat("STRINGS option LIMIT_OUTPUT value \"",
                                 args[i], "\" is not an unsigned integer."));
        return false;
      }
      arg_mode = arg_none;
    } else if (arg_mode == arg_limit_count) {
      int count;
      if (sscanf(args[i].c_str(), "%d", &count) != 1 || count < 0) {
        status.SetError(cmStrCat("STRINGS option LIMIT_COUNT value \"",
                                 args[i], "\" is not an unsigned integer."));
        return false;
      }
      limit_count = count;
      arg_mode = arg_none;
    } else if (arg_mode == arg_length_minimum) {
      int len;
      if (sscanf(args[i].c_str(), "%d", &len) != 1 || len < 0) {
        status.SetError(cmStrCat("STRINGS option LENGTH_MINIMUM value \"",
                                 args[i], "\" is not an unsigned integer."));
        return false;
      }
      minlen = len;
      arg_mode = arg_none;
    } else if (arg_mode == arg_length_maximum) {
      int len;
      if (sscanf(args[i].c_str(), "%d", &len) != 1 || len < 0) {
        status.SetError(cmStrCat("STRINGS option LENGTH_MAXIMUM value \"",
                                 args[i], "\" is not an unsigned integer."));
        return false;
      }
      maxlen = len;
      arg_mode = arg_none;
    } else if (arg_mode == arg_regex) {
      if (!regex.compile(args[i])) {
        status.SetError(cmStrCat("STRINGS option REGEX value \"", args[i],
                                 "\" could not be compiled."));
        return false;
      }
      have_regex = true;
      switch (status.GetMakefile().GetPolicyStatus(cmPolicies::CMP0159)) {
        case cmPolicies::REQUIRED_IF_USED:
        case cmPolicies::REQUIRED_ALWAYS:
        case cmPolicies::NEW:
          // store_regex = true
          break;
        case cmPolicies::WARN:
          if (status.GetMakefile().PolicyOptionalWarningEnabled(
                "CMAKE_POLICY_WARNING_CMP0159")) {
            status.GetMakefile().IssueMessage(
              MessageType::AUTHOR_WARNING,
              cmStrCat(cmPolicies::GetPolicyWarning(cmPolicies::CMP0159), '\n',
                       "For compatibility, CMake is leaving CMAKE_MATCH_<n> "
                       "unchanged."));
          }
          CM_FALLTHROUGH;
        case cmPolicies::OLD:
          store_regex = false;
          break;
      }
      arg_mode = arg_none;
    } else if (arg_mode == arg_encoding) {
      if (args[i] == "UTF-8") {
        encoding = encoding_utf8;
      } else if (args[i] == "UTF-16LE") {
        encoding = encoding_utf16le;
      } else if (args[i] == "UTF-16BE") {
        encoding = encoding_utf16be;
      } else if (args[i] == "UTF-32LE") {
        encoding = encoding_utf32le;
      } else if (args[i] == "UTF-32BE") {
        encoding = encoding_utf32be;
      } else {
        status.SetError(cmStrCat("STRINGS option ENCODING \"", args[i],
                                 "\" not recognized."));
        return false;
      }
      arg_mode = arg_none;
    } else {
      status.SetError(
        cmStrCat("STRINGS given unknown argument \"", args[i], "\""));
      return false;
    }
  }

  if (hex_conversion_enabled) {
    // TODO: should work without temp file, but just on a memory buffer
    std::string binaryFileName =
      cmStrCat(status.GetMakefile().GetCurrentBinaryDirectory(),
               "/CMakeFiles/FileCommandStringsBinaryFile");
    if (cmHexFileConverter::TryConvert(fileName, binaryFileName)) {
      fileName = binaryFileName;
    }
  }

// Open the specified file.
#if defined(_WIN32) || defined(__CYGWIN__)
  cmsys::ifstream fin(fileName.c_str(), std::ios::in | std::ios::binary);
#else
  cmsys::ifstream fin(fileName.c_str());
#endif
  if (!fin) {
    status.SetError(
      cmStrCat("STRINGS file \"", fileName, "\" cannot be read."));
    return false;
  }

  // If BOM is found and encoding was not specified, use the BOM
  int bom_found = cmsys::FStream::ReadBOM(fin);
  if (encoding == encoding_none && bom_found != cmsys::FStream::BOM_None) {
    encoding = bom_found;
  }

  unsigned int bytes_rem = 0;
  if (encoding == encoding_utf16le || encoding == encoding_utf16be) {
    bytes_rem = 1;
  }
  if (encoding == encoding_utf32le || encoding == encoding_utf32be) {
    bytes_rem = 3;
  }

  // Parse strings out of the file.
  int output_size = 0;
  std::vector<std::string> strings;
  std::string s;
  while ((!limit_count || strings.size() < limit_count) &&
         (limit_input < 0 || static_cast<int>(fin.tellg()) < limit_input) &&
         fin) {
    std::string current_str;

    int c = fin.get();
    for (unsigned int i = 0; i < bytes_rem; ++i) {
      int c1 = fin.get();
      if (!fin) {
        fin.putback(static_cast<char>(c1));
        break;
      }
      c = (c << 8) | c1;
    }
    if (encoding == encoding_utf16le) {
      c = ((c & 0xFF) << 8) | ((c & 0xFF00) >> 8);
    } else if (encoding == encoding_utf32le) {
      c = (((c & 0xFF) << 24) | ((c & 0xFF00) << 8) | ((c & 0xFF0000) >> 8) |
           ((c & 0xFF000000) >> 24));
    }

    if (c == '\r') {
      // Ignore CR character to make output always have UNIX newlines.
      continue;
    }

    if (c >= 0 && c <= 0xFF &&
        (isprint(c) || c == '\t' || (c == '\n' && newline_consume))) {
      // This is an ASCII character that may be part of a string.
      // Cast added to avoid compiler warning. Cast is ok because
      // c is guaranteed to fit in char by the above if...
      current_str += static_cast<char>(c);
    } else if (encoding == encoding_utf8) {
      // Check for UTF-8 encoded string (up to 4 octets)
      static const unsigned char utf8_check_table[3][2] = {
        { 0xE0, 0xC0 },
        { 0xF0, 0xE0 },
        { 0xF8, 0xF0 },
      };

      // how many octets are there?
      unsigned int num_utf8_bytes = 0;
      for (unsigned int j = 0; num_utf8_bytes == 0 && j < 3; j++) {
        if ((c & utf8_check_table[j][0]) == utf8_check_table[j][1]) {
          num_utf8_bytes = j + 2;
        }
      }

      // get subsequent octets and check that they are valid
      for (unsigned int j = 0; j < num_utf8_bytes; j++) {
        if (j != 0) {
          c = fin.get();
          if (!fin || (c & 0xC0) != 0x80) {
            fin.putback(static_cast<char>(c));
            break;
          }
        }
        current_str += static_cast<char>(c);
      }

      // if this was an invalid utf8 sequence, discard the data, and put
      // back subsequent characters
      if ((current_str.length() != num_utf8_bytes)) {
        for (unsigned int j = 0; j < current_str.size() - 1; j++) {
          fin.putback(current_str[current_str.size() - 1 - j]);
        }
        current_str.clear();
      }
    }

    if (c == '\n' && !newline_consume) {
      // The current line has been terminated.  Check if the current
      // string matches the requirements.  The length may now be as
      // low as zero since blank lines are allowed.
      if (s.length() >= minlen && (!have_regex || regex.find(s))) {
        if (store_regex) {
          status.GetMakefile().ClearMatches();
          status.GetMakefile().StoreMatches(regex);
        }
        output_size += static_cast<int>(s.size()) + 1;
        if (limit_output >= 0 && output_size >= limit_output) {
          s.clear();
          break;
        }
        strings.push_back(s);
      }

      // Reset the string to empty.
      s.clear();
    } else if (current_str.empty()) {
      // A non-string character has been found.  Check if the current
      // string matches the requirements.  We require that the length
      // be at least one no matter what the user specified.
      if (s.length() >= minlen && !s.empty() &&
          (!have_regex || regex.find(s))) {
        if (store_regex) {
          status.GetMakefile().ClearMatches();
          status.GetMakefile().StoreMatches(regex);
        }
        output_size += static_cast<int>(s.size()) + 1;
        if (limit_output >= 0 && output_size >= limit_output) {
          s.clear();
          break;
        }
        strings.push_back(s);
      }

      // Reset the string to empty.
      s.clear();
    } else {
      s += current_str;
    }

    if (maxlen > 0 && s.size() == maxlen) {
      // Terminate a string if the maximum length is reached.
      if (s.length() >= minlen && (!have_regex || regex.find(s))) {
        if (store_regex) {
          status.GetMakefile().ClearMatches();
          status.GetMakefile().StoreMatches(regex);
        }
        output_size += static_cast<int>(s.size()) + 1;
        if (limit_output >= 0 && output_size >= limit_output) {
          s.clear();
          break;
        }
        strings.push_back(s);
      }
      s.clear();
    }
  }

  // If there is a non-empty current string we have hit the end of the
  // input file or the input size limit.  Check if the current string
  // matches the requirements.
  if ((!limit_count || strings.size() < limit_count) && !s.empty() &&
      s.length() >= minlen && (!have_regex || regex.find(s))) {
    if (store_regex) {
      status.GetMakefile().ClearMatches();
      status.GetMakefile().StoreMatches(regex);
    }
    output_size += static_cast<int>(s.size()) + 1;
    if (limit_output < 0 || output_size < limit_output) {
      strings.push_back(s);
    }
  }

  // Encode the result in a CMake list.
  const char* sep = "";
  std::string output;
  for (std::string const& sr : strings) {
    // Separate the strings in the output to make it a list.
    output += sep;
    sep = ";";

    // Store the string in the output, but escape semicolons to
    // make sure it is a list.
    for (char i : sr) {
      if (i == ';') {
        output += '\\';
      }
      output += i;
    }
  }

  // Save the output in a makefile variable.
  status.GetMakefile().AddDefinition(outVar, output);
  return true;
}